

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_any(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lysp_node *plVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  long *plVar7;
  lysp_ext_instance *plVar8;
  char *pcVar9;
  long lVar10;
  lysp_restr *must_p;
  long lVar11;
  lysp_ext_instance *plVar12;
  
  plVar1 = pnode[1].parent;
  if (plVar1 != (lysp_node *)0x0) {
    lVar10 = *(long *)(node + 1);
    if (lVar10 == 0) {
      lVar11 = 0;
      plVar7 = (long *)calloc(1,(long)plVar1[-1].exts * 0x38 + 8);
    }
    else {
      lVar11 = *(long *)(lVar10 + -8);
      plVar7 = (long *)realloc((void *)(lVar10 + -8),
                               ((long)&(plVar1[-1].exts)->name + *(long *)(lVar10 + -8) + lVar11) *
                               0x38 + 8);
    }
    if (plVar7 == (long *)0x0) {
      bVar3 = false;
      LVar6 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_any");
      bVar4 = true;
    }
    else {
      *(long **)(node + 1) = plVar7 + 1;
      LVar6 = LY_SUCCESS;
      if (pnode[1].parent == (lysp_node *)0x0) {
        plVar12 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar12 = pnode[1].parent[-1].exts;
      }
      memset(plVar7 + *plVar7 * 7 + 1,0,((long)&plVar12->name + lVar11) * 0x38);
      bVar3 = true;
      bVar4 = false;
    }
    if (bVar3) {
      plVar12 = (lysp_ext_instance *)0xffffffffffffffff;
      lVar10 = 0;
      LVar5 = LVar6;
      do {
        LVar6 = LVar5;
        plVar1 = pnode[1].parent;
        if (plVar1 == (lysp_node *)0x0) {
          plVar8 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar8 = plVar1[-1].exts;
        }
        plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
        if (plVar8 <= plVar12) {
          bVar4 = false;
          goto LAB_0014ca07;
        }
        lVar11 = *(long *)(node + 1);
        uVar2 = *(ulong *)(lVar11 + -8);
        must_p = (lysp_restr *)((long)&plVar1->parent + lVar10);
        lVar10 = lVar10 + 0x40;
        *(ulong *)(lVar11 + -8) = uVar2 + 1;
        LVar6 = lys_compile_must(ctx,must_p,
                                 (lysc_must *)((-(ulong)(lVar11 == 0) | uVar2) * 0x38 + lVar11));
        LVar5 = LY_SUCCESS;
      } while (LVar6 == LY_SUCCESS);
      bVar4 = true;
    }
LAB_0014ca07:
    if (bVar4) {
      return LVar6;
    }
  }
  LVar6 = lysc_unres_must_add(ctx,node,pnode);
  if ((LVar6 == LY_SUCCESS) && (LVar6 = LY_SUCCESS, (node->flags & 1) != 0)) {
    pcVar9 = lyplg_ext_stmt2str((uint)(node->nodetype != 0x60) * 0x20 + LY_STMT_ANYDATA);
    LVar6 = LY_SUCCESS;
    ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
           "Use of %s to define configuration data is not recommended. %s",pcVar9,ctx->path);
  }
  return LVar6;
}

Assistant:

static LY_ERR
lys_compile_node_any(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_anydata *any_p = (struct lysp_node_anydata *)pnode;
    struct lysc_node_anydata *any = (struct lysc_node_anydata *)node;
    LY_ERR ret = LY_SUCCESS;

    COMPILE_ARRAY_GOTO(ctx, any_p->musts, any->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    if (any->flags & LYS_CONFIG_W) {
        LOGVRB("Use of %s to define configuration data is not recommended. %s",
                lyplg_ext_stmt2str(any->nodetype == LYS_ANYDATA ? LY_STMT_ANYDATA : LY_STMT_ANYXML), ctx->path);
    }
done:
    return ret;
}